

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

int __thiscall fmt::v5::file::dup2(file *this,int __fd,int __fd2)

{
  int iVar1;
  int *piVar2;
  undefined7 uVar3;
  char *s;
  int *in_stack_00000018;
  int *in_stack_00000020;
  int in_stack_0000002c;
  system_error *in_stack_00000030;
  int result;
  uint in_stack_ffffffffffffffc4;
  char cVar4;
  
  do {
    iVar1 = ::dup2(this->fd_,__fd);
    uVar3 = 0;
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      uVar3 = (undefined7)((ulong)piVar2 >> 8);
      in_stack_ffffffffffffffc4 = CONCAT13(*piVar2 == 4,(int3)in_stack_ffffffffffffffc4);
    }
    cVar4 = (char)(in_stack_ffffffffffffffc4 >> 0x18);
  } while (cVar4 != '\0');
  if (iVar1 == -1) {
    s = (char *)__cxa_allocate_exception(0x18);
    piVar2 = __errno_location();
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)CONCAT44(in_stack_ffffffffffffffc4,*piVar2),s);
    system_error::system_error<int,int>
              (in_stack_00000030,in_stack_0000002c,(string_view)_result,in_stack_00000020,
               in_stack_00000018);
    __cxa_throw(s,&system_error::typeinfo,system_error::~system_error);
  }
  return (int)CONCAT71(uVar3,cVar4);
}

Assistant:

void file::dup2(int fd) {
  int result = 0;
  FMT_RETRY(result, FMT_POSIX_CALL(dup2(fd_, fd)));
  if (result == -1) {
    FMT_THROW(system_error(errno,
      "cannot duplicate file descriptor {} to {}", fd_, fd));
  }
}